

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O3

void xercesc_4_0::XMLBigDecimal::parseDecimal
               (XMLCh *toParse,XMLCh *retBuffer,int *sign,int *totalDigits,int *fractDigits,
               MemoryManager *manager)

{
  XMLCh *pXVar1;
  short *psVar2;
  ushort uVar3;
  XMLCh XVar4;
  int iVar5;
  long lVar6;
  NumberFormatException *this;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  bool bVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  
  *retBuffer = L'\0';
  *totalDigits = 0;
  *fractDigits = 0;
  lVar10 = -2;
  do {
    lVar6 = lVar10;
    uVar3 = *(ushort *)((long)toParse + lVar6 + 2);
    lVar10 = lVar6 + 2;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[uVar3] < '\0');
  if (uVar3 == 0) {
    this = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
               ,0xdd,XMLNUM_WSString,manager);
  }
  else {
    lVar12 = 0;
    if (toParse != (XMLCh *)0x0) {
      do {
        psVar2 = (short *)((long)toParse + lVar12);
        lVar12 = lVar12 + 2;
      } while (*psVar2 != 0);
      lVar12 = (lVar12 >> 1) + -1;
    }
    lVar14 = (long)toParse + lVar6 + 4;
    lVar6 = -2 - (long)(toParse + lVar12);
    pXVar7 = toParse + lVar12 + 1;
    lVar12 = lVar10 + lVar12 * -2;
    do {
      pXVar8 = pXVar7 + -2;
      lVar6 = lVar6 + 2;
      pXVar7 = pXVar7 + -1;
      lVar12 = lVar12 + 2;
    } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*pXVar8] < '\0');
    *sign = 1;
    if (uVar3 == 0x2b) {
      lVar10 = lVar14;
      if (lVar12 != 0) goto LAB_002490f6;
      this = (NumberFormatException *)__cxa_allocate_exception(0x30);
      NumberFormatException::NumberFormatException
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                 ,0xf5,XMLNUM_Inv_chars,manager);
    }
    else {
      lVar10 = (long)toParse + lVar10;
      if ((uVar3 != 0x2d) || (*sign = -1, lVar10 = lVar14, lVar12 != 0)) {
LAB_002490f6:
        pXVar8 = (XMLCh *)(lVar10 - 2);
        do {
          pXVar1 = pXVar8 + 1;
          pXVar8 = pXVar8 + 1;
        } while (*pXVar1 == L'0');
        if (pXVar8 < pXVar7) {
          bVar9 = false;
          do {
            uVar13 = -(long)pXVar8 - lVar6;
            while (XVar4 = *pXVar8, XVar4 == L'.') {
              if (bVar9) {
                this = (NumberFormatException *)__cxa_allocate_exception(0x30);
                NumberFormatException::NumberFormatException
                          (this,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                           ,0x115,XMLNUM_2ManyDecPoint,manager);
                goto LAB_002491e9;
              }
              iVar11 = (int)(uVar13 >> 1) + -1;
              *fractDigits = iVar11;
              pXVar8 = pXVar8 + 1;
              uVar13 = uVar13 - 2;
              bVar9 = true;
              if (pXVar7 <= pXVar8) goto LAB_00249172;
            }
            if ((ushort)(XVar4 + L'ￆ') < 0xfff6) {
              this = (NumberFormatException *)__cxa_allocate_exception(0x30);
              NumberFormatException::NumberFormatException
                        (this,
                         "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                         ,0x11a,XMLNUM_Inv_chars,manager);
              goto LAB_002491e9;
            }
            pXVar8 = pXVar8 + 1;
            *retBuffer = XVar4;
            retBuffer = retBuffer + 1;
            *totalDigits = *totalDigits + 1;
          } while (pXVar8 < pXVar7);
          iVar11 = *fractDigits;
LAB_00249172:
          if (iVar11 < 1) {
LAB_002491a0:
            iVar5 = *totalDigits;
          }
          else {
            do {
              if (retBuffer[-1] != L'0') goto LAB_002491a0;
              retBuffer = retBuffer + -1;
              *fractDigits = iVar11 + -1;
              iVar5 = *totalDigits + -1;
              *totalDigits = iVar5;
              iVar11 = *fractDigits;
            } while (0 < iVar11);
          }
          if (iVar5 == 0) {
            *sign = 0;
          }
          *retBuffer = L'\0';
        }
        else {
          *sign = 0;
        }
        return;
      }
      this = (NumberFormatException *)__cxa_allocate_exception(0x30);
      NumberFormatException::NumberFormatException
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                 ,0xed,XMLNUM_Inv_chars,manager);
    }
  }
LAB_002491e9:
  __cxa_throw(this,&NumberFormatException::typeinfo,XMLException::~XMLException);
}

Assistant:

void  XMLBigDecimal::parseDecimal(const XMLCh* const toParse
                               ,        XMLCh* const retBuffer
                               ,        int&         sign
                               ,        int&         totalDigits
                               ,        int&         fractDigits
                               ,        MemoryManager* const manager)
{
    //init
    retBuffer[0] = chNull;
    totalDigits = 0;
    fractDigits = 0;

    // Strip leading white space, if any. 
    const XMLCh* startPtr = toParse;
    while (XMLChar1_0::isWhitespace(*startPtr))
        startPtr++;

    // If we hit the end, then return failure
    if (!*startPtr)
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_WSString, manager);

    // Strip tailing white space, if any.
    const XMLCh* endPtr = toParse + XMLString::stringLen(toParse);
    while (XMLChar1_0::isWhitespace(*(endPtr - 1)))
        endPtr--;

    // '+' or '-' is allowed only at the first position
    // and is NOT included in the return parsed string
    sign = 1;
    if (*startPtr == chDash)
    {
        sign = -1;
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }
    else if (*startPtr == chPlus)
    {
        startPtr++;         
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }

    // Strip leading zeros
    while (*startPtr == chDigit_0)
        startPtr++;

    // containning zero, only zero, nothing but zero
    // it is a zero, indeed
    if (startPtr >= endPtr)
    {
        sign = 0;
        return;
    }

    XMLCh* retPtr = (XMLCh*) retBuffer;

    // Scan data
    bool   dotSignFound = false;
    while (startPtr < endPtr)
    {
        if (*startPtr == chPeriod)
        {
            if (!dotSignFound)
            {
                dotSignFound = true;
                fractDigits = (int)(endPtr - startPtr - 1);
                startPtr++;
                continue;
            }
            else  // '.' is allowed only once
                ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_2ManyDecPoint, manager);
        }

        // If not valid decimal digit, then an error
        if ((*startPtr < chDigit_0) || (*startPtr > chDigit_9))
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);

        // copy over
        *retPtr++ = *startPtr++;
        totalDigits++;
    }

    /***
    E2-44 totalDigits

     ... by restricting it to numbers that are expressible as i x 10^-n
     where i and n are integers such that |i| < 10^totalDigits and 0 <= n <= totalDigits. 

        normalization: remove all trailing zero after the '.'
                       and adjust the scaleValue as well.
    ***/
    while ((fractDigits > 0) && (*(retPtr-1) == chDigit_0))          
    {
        retPtr--;
        fractDigits--;
        totalDigits--;
    }
    // 0.0 got past the check for zero because of the decimal point, so we need to double check it here
    if(totalDigits==0)
        sign = 0;

    *retPtr = chNull;   //terminated
    return;
}